

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O1

void print_usage(char *cmd)

{
  printf("%s - calculate CAN bit timing parameters.\n",cmd);
  printf("Usage: %s [options] [<CAN-contoller-name>]\nOptions:\n\t-q             don\'t print header line\n\t-v             verbose output, print bit timing const\n\t-l             list all support CAN controller names\n\t-b <bitrate>   arbitration bit-rate in bits/sec\n\t-d <bitrate>   data bit-rate in bits/sec\n\t-s <samp_pt>   sample-point in one-tenth of a percent\n\t               or 0 for CIA recommended sample points\n\t-c <clock>     real CAN system clock in Hz\n\t--alg <alg>    choose specified algorithm for bit-timing calculation\n\nOr supply low level bit timing parameters to decode them:\n\n\t--tq           Time quantum in ns\n\t--prop-seg     Propagation segment in TQs\n\t--phase-seg1   Phase buffer segment 1 in TQs\n\t--phase-seg2   Phase buffer segment 2 in TQs\n\t--sjw          Synchronisation jump width in TQs\n\t--brp          Bit-rate prescaler\n\t--tseg1        Time segment 1 = prop-seg + phase-seg1\n\t--tseg2        Time segment 2 = phase_seg2\n"
         ,cmd);
  return;
}

Assistant:

static void print_usage(char *cmd)
{
	printf("%s - calculate CAN bit timing parameters.\n", cmd);
	printf("Usage: %s [options] [<CAN-contoller-name>]\n"
	       "Options:\n"
	       "\t-q             don't print header line\n"
	       "\t-v             verbose output, print bit timing const\n"
	       "\t-l             list all support CAN controller names\n"
	       "\t-b <bitrate>   arbitration bit-rate in bits/sec\n"
	       "\t-d <bitrate>   data bit-rate in bits/sec\n"
	       "\t-s <samp_pt>   sample-point in one-tenth of a percent\n"
	       "\t               or 0 for CIA recommended sample points\n"
	       "\t-c <clock>     real CAN system clock in Hz\n"
	       "\t--alg <alg>    choose specified algorithm for bit-timing calculation\n"
	       "\n"
	       "Or supply low level bit timing parameters to decode them:\n"
	       "\n"
	       "\t--tq           Time quantum in ns\n"
	       "\t--prop-seg     Propagation segment in TQs\n"
	       "\t--phase-seg1   Phase buffer segment 1 in TQs\n"
	       "\t--phase-seg2   Phase buffer segment 2 in TQs\n"
	       "\t--sjw          Synchronisation jump width in TQs\n"
	       "\t--brp          Bit-rate prescaler\n"
	       "\t--tseg1        Time segment 1 = prop-seg + phase-seg1\n"
	       "\t--tseg2        Time segment 2 = phase_seg2\n",
	       cmd);
}